

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

void __thiscall
helics::PublicationInfo::disconnectFederate(PublicationInfo *this,GlobalFederateId fedToDisconnect)

{
  const_iterator __first;
  iterator this_00;
  undefined4 in_ESI;
  __normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  *in_RDI;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
  *in_stack_ffffffffffffff98;
  anon_class_4_1_6f9e477c_for__M_pred __pred;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  __pred.fedToDisconnect.gid = SUB84((ulong)(in_RDI + 1) >> 0x20,0);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::begin
            (in_stack_ffffffffffffff98);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::end
            (in_stack_ffffffffffffff98);
  std::
  remove_if<__gnu_cxx::__normal_iterator<helics::SubscriberInformation*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>,helics::PublicationInfo::disconnectFederate(helics::GlobalFederateId)::__0>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__pred);
  __gnu_cxx::
  __normal_iterator<helics::SubscriberInformation_const*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>
  ::__normal_iterator<helics::SubscriberInformation*>
            (in_RDI,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                     *)in_stack_ffffffffffffff98);
  this_00 = std::
            vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
            end(in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<helics::SubscriberInformation_const*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>
  ::__normal_iterator<helics::SubscriberInformation*>
            (in_RDI,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                     *)in_stack_ffffffffffffff98);
  __first._M_current._4_4_ = in_ESI;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc8;
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::erase
            ((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              *)this_00._M_current,__first,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void PublicationInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [fedToDisconnect](const auto& val) {
                                         return val.id.fed_id == fedToDisconnect;
                                     }),
                      subscribers.end());
}